

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

GLfloat * __thiscall
PrimitiveDisplayer::vectorToArray
          (PrimitiveDisplayer *this,vector<Vec2d_*,_std::allocator<Vec2d_*>_> *vecs)

{
  Vec2d *this_00;
  bool bVar1;
  GLfloat *pGVar2;
  reference ppVVar3;
  int iVar4;
  float fVar5;
  Vec2d *vec;
  iterator __end1;
  iterator __begin1;
  vector<Vec2d_*,_std::allocator<Vec2d_*>_> *__range1;
  GLfloat *vertices;
  int i;
  vector<Vec2d_*,_std::allocator<Vec2d_*>_> *vecs_local;
  PrimitiveDisplayer *this_local;
  
  vertices._4_4_ = 0;
  pGVar2 = (GLfloat *)operator_new__(0x20);
  __end1 = std::vector<Vec2d_*,_std::allocator<Vec2d_*>_>::begin(vecs);
  vec = (Vec2d *)std::vector<Vec2d_*,_std::allocator<Vec2d_*>_>::end(vecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Vec2d_**,_std::vector<Vec2d_*,_std::allocator<Vec2d_*>_>_>
                                *)&vec);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<Vec2d_**,_std::vector<Vec2d_*,_std::allocator<Vec2d_*>_>_>::
              operator*(&__end1);
    this_00 = *ppVVar3;
    fVar5 = Vec2d::getX(this_00);
    iVar4 = vertices._4_4_ + 1;
    pGVar2[vertices._4_4_] = fVar5;
    fVar5 = Vec2d::getY(this_00);
    vertices._4_4_ = vertices._4_4_ + 2;
    pGVar2[iVar4] = fVar5;
    __gnu_cxx::__normal_iterator<Vec2d_**,_std::vector<Vec2d_*,_std::allocator<Vec2d_*>_>_>::
    operator++(&__end1);
  }
  return pGVar2;
}

Assistant:

GLfloat* PrimitiveDisplayer::vectorToArray(vector<Vec2d*>* vecs) {
    int i = 0;
    GLfloat* vertices = new GLfloat[8];
    for (auto vec : *vecs) {
        vertices[i++] = vec->getX();
        vertices[i++] = vec->getY();
    }
    return vertices;
}